

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O3

void __thiscall Poll::Poll(Poll *this)

{
  _Rb_tree_header *p_Var1;
  int val;
  _union_1457 local_b8;
  undefined1 local_b0 [144];
  
  (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->subs)._M_h._M_buckets = &(this->subs)._M_h._M_single_bucket;
  (this->subs)._M_h._M_bucket_count = 1;
  (this->subs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->subs)._M_h._M_element_count = 0;
  (this->subs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->subs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->subs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->alarms)._M_t._M_impl.super__Rb_tree_header;
  (this->alarms)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->alarms)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->alarms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->alarms)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->alarms)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->shutdown = false;
  memset(local_b0,0,0x90);
  local_b8 = (_union_1457)0x1;
  val = sigaction(0xd,(sigaction *)&local_b8,(sigaction *)0x0);
  no_err(val,"Could not ignore sigpipe");
  return;
}

Assistant:

Poll::Poll() : shutdown(false) {
  struct sigaction sa;
  bzero(&sa, sizeof(sa));
  sa.sa_handler = SIG_IGN;
  sa.sa_flags = 0;
  no_err(sigaction(SIGPIPE, &sa, 0), "Could not ignore sigpipe");
}